

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

void oaep_mask(ssh_hashalg *h,void *seed,int seedlen,void *vdata,int datalen)

{
  ssh_hash *h_00;
  int local_d0;
  byte local_c8 [8];
  uchar hash [114];
  int local_4c;
  int max;
  int i;
  ssh_hash *s;
  void *pvStack_38;
  uint count;
  uchar *data;
  int datalen_local;
  void *vdata_local;
  int seedlen_local;
  void *seed_local;
  ssh_hashalg *h_local;
  
  s._4_4_ = 0;
  h_00 = ssh_hash_new(h);
  pvStack_38 = vdata;
  data._4_4_ = datalen;
  while( true ) {
    if (data._4_4_ < 1) {
      ssh_hash_free(h_00);
      return;
    }
    if (h->hlen < (ulong)(long)data._4_4_) {
      local_d0 = (int)h->hlen;
    }
    else {
      local_d0 = data._4_4_;
    }
    register0x00000000 = local_d0;
    ssh_hash_reset(h_00);
    if (0x72 < h->hlen) break;
    BinarySink_put_data(h_00->binarysink_,seed,(long)seedlen);
    BinarySink_put_uint32(h_00->binarysink_,(ulong)s._4_4_);
    ssh_hash_digest(h_00,local_c8);
    s._4_4_ = s._4_4_ + 1;
    for (local_4c = 0; local_4c < stack0xffffffffffffffb0; local_4c = local_4c + 1) {
      *(byte *)((long)pvStack_38 + (long)local_4c) =
           *(byte *)((long)pvStack_38 + (long)local_4c) ^ local_c8[local_4c];
    }
    pvStack_38 = (void *)((long)pvStack_38 + (long)stack0xffffffffffffffb0);
    data._4_4_ = data._4_4_ - stack0xffffffffffffffb0;
  }
  __assert_fail("h->hlen <= MAX_HASH_LEN",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c",
                0x3ac,"void oaep_mask(const ssh_hashalg *, void *, int, void *, int)");
}

Assistant:

static void oaep_mask(const ssh_hashalg *h, void *seed, int seedlen,
                      void *vdata, int datalen)
{
    unsigned char *data = (unsigned char *)vdata;
    unsigned count = 0;

    ssh_hash *s = ssh_hash_new(h);

    while (datalen > 0) {
        int i, max = (datalen > h->hlen ? h->hlen : datalen);
        unsigned char hash[MAX_HASH_LEN];

        ssh_hash_reset(s);
        assert(h->hlen <= MAX_HASH_LEN);
        put_data(s, seed, seedlen);
        put_uint32(s, count);
        ssh_hash_digest(s, hash);
        count++;

        for (i = 0; i < max; i++)
            data[i] ^= hash[i];

        data += max;
        datalen -= max;
    }

    ssh_hash_free(s);
}